

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cpp
# Opt level: O1

void __thiscall VertexBuffer::VertexBuffer(VertexBuffer *this,uint32_t size,bool immutable)

{
  (this->m_layout).elements.super__Vector_base<BufferElement,_std::allocator<BufferElement>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_layout).elements.super__Vector_base<BufferElement,_std::allocator<BufferElement>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_layout).elements.super__Vector_base<BufferElement,_std::allocator<BufferElement>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_layout).stride = 0;
  (*glad_glGenBuffers)(1,&this->m_id);
  (*glad_glBindBuffer)(0x8892,this->m_id);
  (*glad_glBufferData)(0x8892,(GLsizeiptr)size,(void *)0x0,0x88e8);
  return;
}

Assistant:

VertexBuffer::VertexBuffer(uint32_t size, bool immutable)
{
    init_buffer();

    // Dynamic - for data to be uploaded later
#if OPENGL_VERSION >= 45
    if (immutable)
        glNamedBufferStorage(m_id, size, nullptr, GL_DYNAMIC_STORAGE_BIT);
    else
        glNamedBufferData(m_id, size, nullptr, GL_DYNAMIC_DRAW);
#elif OPENGL_VERSION >= 44
    bind();

    if (immutable)
        glBufferStorage(GL_ARRAY_BUFFER, size, nullptr, GL_DYNAMIC_STORAGE_BIT);
    else
        glBufferData(GL_ARRAY_BUFFER, size, nullptr, GL_DYNAMIC_DRAW);
#else
    bind();
    glBufferData(GL_ARRAY_BUFFER, size, nullptr, GL_DYNAMIC_DRAW);
#endif
}